

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

size_type __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> v,size_type pos)

{
  char cVar1;
  ulong uVar2;
  const_pointer pcVar3;
  long lVar4;
  size_type sVar5;
  char *pcVar6;
  size_type sVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  bool bVar14;
  
  sVar7 = v.size_;
  pcVar9 = v.data_;
  if (pcVar9 == (char *)0x0 && sVar7 != 0) {
    __assert_fail("v.size() == 0 || v.data() != nssv_nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/inja.hpp"
                  ,0x292,
                  "size_type nonstd::sv_lite::basic_string_view<char>::find(basic_string_view<CharT, Traits>, size_type) const [CharT = char, Traits = std::char_traits<char>]"
                 );
  }
  uVar2 = this->size_;
  uVar13 = uVar2 - pos;
  if (uVar2 < pos || uVar13 == 0) {
    return 0xffffffffffffffff;
  }
  pcVar3 = this->data_;
  pcVar11 = pcVar3 + pos;
  pcVar10 = pcVar3 + uVar2;
  pcVar6 = pcVar11;
  if (sVar7 != 0) {
    if (sVar7 == 1) {
      if (0 < (long)uVar13 >> 2) {
        cVar1 = *pcVar9;
        pcVar11 = pcVar3 + pos + (uVar13 & 0xfffffffffffffffc);
        lVar8 = ((long)uVar13 >> 2) + 1;
        pcVar6 = pcVar3 + pos + 1;
        do {
          if (pcVar6[-1] == cVar1) {
            pcVar6 = pcVar6 + -1;
            goto LAB_00189bb2;
          }
          if (*pcVar6 == cVar1) goto LAB_00189bb2;
          if (pcVar6[1] == cVar1) {
            pcVar6 = pcVar6 + 1;
            goto LAB_00189bb2;
          }
          if (pcVar6[2] == cVar1) {
            pcVar6 = pcVar6 + 2;
            goto LAB_00189bb2;
          }
          lVar8 = lVar8 + -1;
          pcVar6 = pcVar6 + 4;
        } while (1 < lVar8);
      }
      lVar8 = (long)pcVar10 - (long)pcVar11;
      if (lVar8 != 1) {
        pcVar6 = pcVar11;
        if (lVar8 != 2) {
          pcVar6 = pcVar10;
          if ((lVar8 != 3) || (pcVar6 = pcVar11, *pcVar11 == *pcVar9)) goto LAB_00189bb2;
          pcVar6 = pcVar11 + 1;
        }
        if (*pcVar6 == *pcVar9) goto LAB_00189bb2;
        pcVar11 = pcVar6 + 1;
      }
      pcVar6 = pcVar11;
      if (*pcVar11 != *pcVar9) {
LAB_00189baf:
        pcVar6 = pcVar10;
      }
    }
    else {
      do {
        lVar8 = (long)pcVar10 - (long)pcVar11 >> 2;
        pcVar6 = pcVar11;
        if (0 < lVar8) {
          cVar1 = *pcVar9;
          pcVar6 = pcVar11 + ((long)pcVar10 - (long)pcVar11 & 0xfffffffffffffffc);
          lVar8 = lVar8 + 1;
          pcVar12 = pcVar11 + 3;
          do {
            if (pcVar12[-3] == cVar1) {
              pcVar12 = pcVar12 + -3;
              goto LAB_00189b37;
            }
            if (pcVar12[-2] == cVar1) {
              pcVar12 = pcVar12 + -2;
              goto LAB_00189b37;
            }
            if (pcVar12[-1] == cVar1) {
              pcVar12 = pcVar12 + -1;
              goto LAB_00189b37;
            }
            if (*pcVar12 == cVar1) goto LAB_00189b37;
            lVar8 = lVar8 + -1;
            pcVar12 = pcVar12 + 4;
          } while (1 < lVar8);
        }
        lVar8 = (long)pcVar10 - (long)pcVar6;
        if (lVar8 == 1) {
LAB_00189b29:
          pcVar12 = pcVar6;
          if (*pcVar6 != *pcVar9) {
            pcVar12 = pcVar10;
          }
        }
        else {
          pcVar12 = pcVar6;
          if (lVar8 == 2) {
LAB_00189b09:
            if (*pcVar12 != *pcVar9) {
              pcVar6 = pcVar12 + 1;
              goto LAB_00189b29;
            }
          }
          else {
            pcVar12 = pcVar10;
            if ((lVar8 == 3) && (pcVar12 = pcVar6, *pcVar6 != *pcVar9)) {
              pcVar12 = pcVar6 + 1;
              goto LAB_00189b09;
            }
          }
        }
LAB_00189b37:
        if (pcVar12 == pcVar10) goto LAB_00189baf;
        if (pcVar12 + 1 == pcVar10) {
          bVar14 = false;
          pcVar6 = pcVar10;
          pcVar11 = pcVar12;
        }
        else {
          lVar8 = 1;
          do {
            bVar14 = pcVar12[lVar8] != pcVar9[lVar8];
            pcVar6 = (char *)pos;
            pcVar11 = pcVar12 + 1;
            if ((bVar14) || (pcVar6 = pcVar12, pcVar11 = pcVar12, (2 - sVar7) + lVar8 == 1)) break;
            lVar4 = lVar8 + 1;
            lVar8 = lVar8 + 1;
            pcVar6 = pcVar10;
          } while (pcVar12 + lVar4 != pcVar10);
        }
        pos = (size_type)pcVar6;
      } while (bVar14);
    }
  }
LAB_00189bb2:
  sVar5 = 0xffffffffffffffff;
  if (pcVar10 != pcVar6) {
    sVar5 = (long)pcVar6 - (long)pcVar3;
  }
  return sVar5;
}

Assistant:

nssv_constexpr14 size_type find(basic_string_view v, size_type pos = 0) const nssv_noexcept  // (1)
		{
			return assert(v.size() == 0 || v.data() != nssv_nullptr),
				   pos >= size() ? npos : to_pos(std::search(cbegin() + pos, cend(), v.cbegin(), v.cend(), Traits::eq));
		}